

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool adios2sys::SystemTools::ParseURL
               (string *URL,string *protocol,string *username,string *password,string *hostname,
               string *dataport,string *database,bool decode)

{
  string *this;
  bool bVar1;
  string sStack_288;
  string *local_268;
  RegularExpression urlRe;
  
  local_268 = dataport;
  RegularExpression::RegularExpression
            (&urlRe,"([a-zA-Z0-9]*)://(([A-Za-z0-9]+)(:([^:@]+))?@)?([^:@/]*)(:([0-9]+))?/(.+)?");
  bVar1 = RegularExpression::find(&urlRe,URL);
  if (bVar1) {
    RegularExpressionMatch::match_abi_cxx11_(&sStack_288,&urlRe.regmatch,1);
    std::__cxx11::string::operator=((string *)protocol,(string *)&sStack_288);
    std::__cxx11::string::~string((string *)&sStack_288);
    RegularExpressionMatch::match_abi_cxx11_(&sStack_288,&urlRe.regmatch,3);
    std::__cxx11::string::operator=((string *)username,(string *)&sStack_288);
    std::__cxx11::string::~string((string *)&sStack_288);
    RegularExpressionMatch::match_abi_cxx11_(&sStack_288,&urlRe.regmatch,5);
    std::__cxx11::string::operator=((string *)password,(string *)&sStack_288);
    std::__cxx11::string::~string((string *)&sStack_288);
    RegularExpressionMatch::match_abi_cxx11_(&sStack_288,&urlRe.regmatch,6);
    std::__cxx11::string::operator=((string *)hostname,(string *)&sStack_288);
    std::__cxx11::string::~string((string *)&sStack_288);
    RegularExpressionMatch::match_abi_cxx11_(&sStack_288,&urlRe.regmatch,8);
    std::__cxx11::string::operator=((string *)local_268,(string *)&sStack_288);
    std::__cxx11::string::~string((string *)&sStack_288);
    RegularExpressionMatch::match_abi_cxx11_(&sStack_288,&urlRe.regmatch,9);
    std::__cxx11::string::operator=((string *)database,(string *)&sStack_288);
    std::__cxx11::string::~string((string *)&sStack_288);
    if (decode) {
      DecodeURL(&sStack_288,username);
      std::__cxx11::string::operator=((string *)username,(string *)&sStack_288);
      std::__cxx11::string::~string((string *)&sStack_288);
      DecodeURL(&sStack_288,password);
      std::__cxx11::string::operator=((string *)password,(string *)&sStack_288);
      std::__cxx11::string::~string((string *)&sStack_288);
      DecodeURL(&sStack_288,hostname);
      std::__cxx11::string::operator=((string *)hostname,(string *)&sStack_288);
      std::__cxx11::string::~string((string *)&sStack_288);
      this = local_268;
      DecodeURL(&sStack_288,local_268);
      std::__cxx11::string::operator=((string *)this,(string *)&sStack_288);
      std::__cxx11::string::~string((string *)&sStack_288);
      DecodeURL(&sStack_288,database);
      std::__cxx11::string::operator=((string *)database,(string *)&sStack_288);
      std::__cxx11::string::~string((string *)&sStack_288);
    }
  }
  RegularExpression::~RegularExpression(&urlRe);
  return bVar1;
}

Assistant:

bool SystemTools::ParseURL(const std::string& URL, std::string& protocol,
                           std::string& username, std::string& password,
                           std::string& hostname, std::string& dataport,
                           std::string& database, bool decode)
{
  kwsys::RegularExpression urlRe(VTK_URL_REGEX);
  if (!urlRe.find(URL))
    return false;

  // match 0 URL
  // match 1 protocol
  // match 2 mangled user
  // match 3 username
  // match 4 mangled password
  // match 5 password
  // match 6 hostname
  // match 7 mangled port
  // match 8 dataport
  // match 9 database name

  protocol = urlRe.match(1);
  username = urlRe.match(3);
  password = urlRe.match(5);
  hostname = urlRe.match(6);
  dataport = urlRe.match(8);
  database = urlRe.match(9);

  if (decode) {
    username = DecodeURL(username);
    password = DecodeURL(password);
    hostname = DecodeURL(hostname);
    dataport = DecodeURL(dataport);
    database = DecodeURL(database);
  }

  return true;
}